

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_node.c
# Opt level: O0

REF_STATUS ref_node_tri_epic_quality(REF_NODE ref_node,REF_INT *nodes,REF_DBL *quality)

{
  uint uVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double local_f8;
  double local_e8;
  double local_e0;
  REF_DBL local_d8;
  REF_STATUS ref_private_macro_code_rss_9;
  REF_STATUS ref_private_macro_code_rss_8;
  REF_STATUS ref_private_macro_code_rss_7;
  REF_STATUS ref_private_macro_code_rss_6;
  REF_STATUS ref_private_macro_code_rss_5;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_DBL m [6];
  REF_DBL denom;
  REF_DBL num;
  REF_DBL area_in_metric;
  REF_DBL area;
  REF_DBL min_det;
  REF_DBL det;
  REF_DBL l2;
  REF_DBL l1;
  REF_DBL l0;
  REF_DBL *quality_local;
  REF_INT *nodes_local;
  REF_NODE ref_node_local;
  
  l0 = (REF_DBL)quality;
  quality_local = (REF_DBL *)nodes;
  nodes_local = &ref_node->n;
  uVar1 = ref_node_ratio(ref_node,*nodes,nodes[1],&l1);
  if (uVar1 == 0) {
    uVar1 = ref_node_ratio((REF_NODE)nodes_local,*(REF_INT *)quality_local,
                           *(REF_INT *)(quality_local + 1),&l2);
    if (uVar1 == 0) {
      uVar1 = ref_node_ratio((REF_NODE)nodes_local,*(REF_INT *)((long)quality_local + 4),
                             *(REF_INT *)(quality_local + 1),&det);
      if (uVar1 == 0) {
        uVar1 = ref_node_tri_area((REF_NODE)nodes_local,(REF_INT *)quality_local,&area_in_metric);
        if (uVar1 == 0) {
          uVar1 = ref_node_metric_get((REF_NODE)nodes_local,*(REF_INT *)quality_local,
                                      (REF_DBL *)&ref_private_macro_code_rss_1);
          if (uVar1 == 0) {
            uVar1 = ref_matrix_det_m((REF_DBL *)&ref_private_macro_code_rss_1,&min_det);
            if (uVar1 == 0) {
              area = min_det;
              uVar1 = ref_node_metric_get((REF_NODE)nodes_local,
                                          *(REF_INT *)((long)quality_local + 4),
                                          (REF_DBL *)&ref_private_macro_code_rss_1);
              if (uVar1 == 0) {
                uVar1 = ref_matrix_det_m((REF_DBL *)&ref_private_macro_code_rss_1,&min_det);
                if (uVar1 == 0) {
                  if (min_det <= area) {
                    local_d8 = min_det;
                  }
                  else {
                    local_d8 = area;
                  }
                  area = local_d8;
                  uVar1 = ref_node_metric_get((REF_NODE)nodes_local,*(REF_INT *)(quality_local + 1),
                                              (REF_DBL *)&ref_private_macro_code_rss_1);
                  if (uVar1 == 0) {
                    uVar1 = ref_matrix_det_m((REF_DBL *)&ref_private_macro_code_rss_1,&min_det);
                    if (uVar1 == 0) {
                      if (min_det <= area) {
                        local_e0 = min_det;
                      }
                      else {
                        local_e0 = area;
                      }
                      area = local_e0;
                      dVar2 = pow(local_e0,0.3333333333333333);
                      dVar2 = dVar2 * area_in_metric;
                      dVar3 = det * det + l1 * l1 + l2 * l2;
                      if (dVar3 * 1e+20 <= 0.0) {
                        local_e8 = -(dVar3 * 1e+20);
                      }
                      else {
                        local_e8 = dVar3 * 1e+20;
                      }
                      local_f8 = dVar2;
                      if (dVar2 <= 0.0) {
                        local_f8 = -dVar2;
                      }
                      if (local_e8 <= local_f8) {
                        *(undefined8 *)l0 = 0xbff0000000000000;
                      }
                      else {
                        dVar4 = sqrt(3.0);
                        *(double *)l0 = ((4.0 / dVar4) * 3.0 * dVar2) / dVar3;
                      }
                      ref_node_local._4_4_ = 0;
                    }
                    else {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c"
                             ,0x7c5,"ref_node_tri_epic_quality",(ulong)uVar1,"n2");
                      ref_node_local._4_4_ = uVar1;
                    }
                  }
                  else {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c"
                           ,0x7c4,"ref_node_tri_epic_quality",(ulong)uVar1,"nodes[2] m");
                    ref_node_local._4_4_ = uVar1;
                  }
                }
                else {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c"
                         ,0x7c1,"ref_node_tri_epic_quality",(ulong)uVar1,"n1");
                  ref_node_local._4_4_ = uVar1;
                }
              }
              else {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c"
                       ,0x7c0,"ref_node_tri_epic_quality",(ulong)uVar1,"nodes[1] m");
                ref_node_local._4_4_ = uVar1;
              }
            }
            else {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c"
                     ,0x7bd,"ref_node_tri_epic_quality",(ulong)uVar1,"n0");
              ref_node_local._4_4_ = uVar1;
            }
          }
          else {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",
                   0x7bc,"ref_node_tri_epic_quality",(ulong)uVar1,"nodes[0] m");
            ref_node_local._4_4_ = uVar1;
          }
        }
        else {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",
                 0x7ba,"ref_node_tri_epic_quality",(ulong)uVar1,"area");
          ref_node_local._4_4_ = uVar1;
        }
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",
               0x7b8,"ref_node_tri_epic_quality",(ulong)uVar1,"l2");
        ref_node_local._4_4_ = uVar1;
      }
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",0x7b7,
             "ref_node_tri_epic_quality",(ulong)uVar1,"l1");
      ref_node_local._4_4_ = uVar1;
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",0x7b6,
           "ref_node_tri_epic_quality",(ulong)uVar1,"l0");
    ref_node_local._4_4_ = uVar1;
  }
  return ref_node_local._4_4_;
}

Assistant:

REF_FCN static REF_STATUS ref_node_tri_epic_quality(REF_NODE ref_node,
                                                    REF_INT *nodes,
                                                    REF_DBL *quality) {
  REF_DBL l0, l1, l2;

  REF_DBL det, min_det, area;
  REF_DBL area_in_metric;
  REF_DBL num, denom;
  REF_DBL m[6];

  RSS(ref_node_ratio(ref_node, nodes[0], nodes[1], &l0), "l0");
  RSS(ref_node_ratio(ref_node, nodes[0], nodes[2], &l1), "l1");
  RSS(ref_node_ratio(ref_node, nodes[1], nodes[2], &l2), "l2");

  RSS(ref_node_tri_area(ref_node, nodes, &area), "area");

  RSS(ref_node_metric_get(ref_node, nodes[0], m), "nodes[0] m");
  RSS(ref_matrix_det_m(m, &det), "n0");
  min_det = det;

  RSS(ref_node_metric_get(ref_node, nodes[1], m), "nodes[1] m");
  RSS(ref_matrix_det_m(m, &det), "n1");
  min_det = MIN(min_det, det);

  RSS(ref_node_metric_get(ref_node, nodes[2], m), "nodes[2] m");
  RSS(ref_matrix_det_m(m, &det), "n2");
  min_det = MIN(min_det, det);

  area_in_metric = pow(min_det, 1.0 / 3.0) * area;

  num = area_in_metric;
  denom = l0 * l0 + l1 * l1 + l2 * l2;

  if (ref_math_divisible(num, denom)) {
    *quality = 4.0 / sqrt(3.0) * 3 * num / denom;
  } else {
    /* printf("%s: %d: %s: div zero area %.18e min_det %.18e (%.18e / %.18e)\n",
       __FILE__, __LINE__, __func__, area, min_det, num, denom); */
    *quality = -1.0;
  }

  return REF_SUCCESS;
}